

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CategoricalMapping::Clear(CategoricalMapping *this)

{
  uint32_t cached_has_bits;
  CategoricalMapping *this_local;
  
  clear_MappingType(this);
  clear_ValueOnUnknown(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CategoricalMapping::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CategoricalMapping)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  clear_MappingType();
  clear_ValueOnUnknown();
  _internal_metadata_.Clear<std::string>();
}